

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t
exr_attr_set_user(exr_context_t ctxt,int part_index,char *name,char *type,int32_t size,void *out)

{
  exr_attr_opaquedata_t *u;
  exr_result_t eVar1;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar2;
  exr_attribute_list_t *list;
  exr_attribute_t *attr;
  exr_attribute_t *local_38;
  
  local_38 = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar1 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar1;
  }
  if (*ctxt == (_priv_exr_context_t)0x3) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar2 = 0x15;
  }
  else {
    if (*ctxt != (_priv_exr_context_t)0x0) {
      list = (exr_attribute_list_t *)
             (*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8);
      eVar1 = exr_attr_list_find_by_name(ctxt,list,name,&local_38);
      if (eVar1 == 0) {
        if (local_38->type != EXR_ATTR_OPAQUE) {
          eVar1 = (**(code **)(ctxt + 0x48))
                            (ctxt,0x10,
                             "\'%s\' requested type \'%s\', but stored attributes is type \'%s\'",
                             name,type,local_38->type_name);
          return eVar1;
        }
      }
      else {
        if (eVar1 != 0xf) {
          return eVar1;
        }
        if (*ctxt != (_priv_exr_context_t)0x1) {
          return 0xf;
        }
        exr_attr_list_add_by_type(ctxt,list,name,type,0,(uint8_t **)0x0,&local_38);
      }
      u = (local_38->field_6).opaque;
      if (u->pack_func_ptr ==
          (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *)0x0) {
        eVar1 = exr_attr_opaquedata_set_packed(ctxt,u,out,size);
      }
      else {
        eVar1 = exr_attr_opaquedata_set_unpacked(ctxt,u,out,size);
        if (eVar1 == 0) {
          eVar1 = exr_attr_opaquedata_pack
                            (ctxt,(local_38->field_6).opaque,(int32_t *)0x0,(void **)0x0);
        }
      }
      return eVar1;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar2 = 8;
  }
  eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar2);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_set_user (
    exr_context_t ctxt,
    int           part_index,
    const char*   name,
    const char*   type,
    int32_t       size,
    const void*   out)
{
    exr_attr_opaquedata_t* opq;
    exr_attribute_t*       attr = NULL;
    exr_result_t           rv   = EXR_ERR_SUCCESS;
    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    if (pctxt->mode == EXR_CONTEXT_READ)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));
    if (pctxt->mode == EXR_CONTEXT_WRITING_DATA)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_ALREADY_WROTE_ATTRS));
    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);
    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        if (pctxt->mode != EXR_CONTEXT_WRITE)
            return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
        rv = exr_attr_list_add_by_type (
            ctxt, &(part->attributes), name, type, 0, NULL, &(attr));
    }
    else if (rv == EXR_ERR_SUCCESS)
    {
        if (attr->type != EXR_ATTR_OPAQUE)
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'%s' requested type '%s', but stored attributes is type '%s'",
                name,
                type,
                attr->type_name));
    }
    else
        return EXR_UNLOCK_AND_RETURN_PCTXT (rv);

    opq = attr->opaque;
    if (opq->pack_func_ptr)
    {
        rv = exr_attr_opaquedata_set_unpacked (
            ctxt, attr->opaque, EXR_CONST_CAST (void*, out), size);
        if (rv == EXR_ERR_SUCCESS)
            rv = exr_attr_opaquedata_pack (ctxt, attr->opaque, NULL, NULL);
    }
    else
        rv = exr_attr_opaquedata_set_packed (ctxt, attr->opaque, out, size);
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}